

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputStream.cpp
# Opt level: O1

void __thiscall cali::OutputStream::set_filename(OutputStream *this,char *filename)

{
  element_type *peVar1;
  char *local_20;
  
  peVar1 = (this->mP).
           super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_20 = filename;
  std::ofstream::close();
  std::filesystem::__cxx11::path::clear(&peVar1->filename);
  peVar1->user_os = (ostream *)0x0;
  peVar1->type = None;
  peVar1->is_initialized = false;
  std::filesystem::__cxx11::path::operator=
            (&((this->mP).
               super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->filename,&local_20);
  ((this->mP).super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr)->type = File;
  return;
}

Assistant:

void OutputStream::set_filename(const char* filename)
{
    mP->reset();

    mP->filename = filename;
    mP->type     = StreamType::File;
}